

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int *in_RCX;
  buffer<char> *in_RDX;
  byte in_SIL;
  int in_EDI;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_2;
  int i;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool even;
  uint64_t significand;
  int shift;
  bool is_predecessor_closer;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffc68;
  undefined2 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  bigint *in_stack_fffffffffffffc80;
  buffer<char> *this;
  undefined1 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc89;
  undefined1 in_stack_fffffffffffffc8a;
  undefined1 in_stack_fffffffffffffc8b;
  char cVar8;
  undefined4 in_stack_fffffffffffffc8c;
  bigint *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca8;
  float in_stack_fffffffffffffcac;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  char local_340;
  int local_33c;
  fp local_308;
  undefined1 *local_2f8;
  undefined1 local_2f0 [176];
  undefined1 local_240 [544];
  int *local_20;
  buffer<char> *local_18;
  byte local_d;
  int local_c;
  
  local_d = in_SIL & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_EDI;
  bigint::bigint(in_stack_fffffffffffffc90);
  bigint::bigint(in_stack_fffffffffffffc90);
  bigint::bigint(in_stack_fffffffffffffc90);
  bigint::bigint(in_stack_fffffffffffffc90);
  local_2f8 = (undefined1 *)0x0;
  fp::fp(&local_308);
  if ((local_d & 1) == 0) {
    bVar2 = fp::assign<double,_0>
                      ((fp *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (double)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    uVar9 = CONCAT13(bVar2,SUB43(in_stack_fffffffffffffcac,0));
  }
  else {
    bVar2 = fp::assign<float,_0>
                      ((fp *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffcac);
    uVar9 = CONCAT13(bVar2,SUB43(in_stack_fffffffffffffcac,0));
  }
  iVar6 = 1;
  if ((char)((uint)uVar9 >> 0x18) != '\0') {
    iVar6 = 2;
  }
  if (local_308.e < 0) {
    if (*local_20 < 0) {
      bigint::assign_pow10
                ((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 CONCAT13(in_stack_fffffffffffffc6f,
                          CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::assign(in_stack_fffffffffffffc90,
                     (bigint *)
                     CONCAT44(in_stack_fffffffffffffc8c,
                              CONCAT13(in_stack_fffffffffffffc8b,
                                       CONCAT12(in_stack_fffffffffffffc8a,
                                                CONCAT11(in_stack_fffffffffffffc89,
                                                         in_stack_fffffffffffffc88)))));
      if (iVar6 != 1) {
        bigint::assign(in_stack_fffffffffffffc90,
                       (bigint *)
                       CONCAT44(in_stack_fffffffffffffc8c,
                                CONCAT13(in_stack_fffffffffffffc8b,
                                         CONCAT12(in_stack_fffffffffffffc8a,
                                                  CONCAT11(in_stack_fffffffffffffc89,
                                                           in_stack_fffffffffffffc88)))));
        bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                            (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        local_2f8 = local_2f0;
      }
      iVar6 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT17(in_stack_fffffffffffffc6f,
                                  CONCAT16(in_stack_fffffffffffffc6e,
                                           CONCAT24(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68))));
      bigint::assign(in_stack_fffffffffffffc80,
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          iVar6);
    }
    else {
      bigint::assign(in_stack_fffffffffffffc80,
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      iVar3 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
      bigint::assign_pow10
                ((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 CONCAT13(in_stack_fffffffffffffc6f,
                          CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          iVar3);
      bigint::assign(in_stack_fffffffffffffc80,
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      if (iVar6 != 1) {
        bigint::assign(in_stack_fffffffffffffc80,
                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_2f8 = local_2f0;
      }
    }
  }
  else {
    bigint::assign(in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    iVar3 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        iVar3);
    bigint::assign(in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        iVar3);
    if (iVar6 != 1) {
      bigint::assign(in_stack_fffffffffffffc80,
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          iVar3);
      local_2f8 = local_2f0;
    }
    bigint::assign_pow10
              ((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               CONCAT13(in_stack_fffffffffffffc6f,
                        CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        iVar3);
  }
  if (local_c < 0) {
    if (local_2f8 == (undefined1 *)0x0) {
      local_2f8 = local_240;
    }
    bVar2 = (local_308.f & 1) == 0;
    local_c = 0;
    pcVar7 = buffer<char>::data(local_18);
    while( true ) {
      iVar3 = bigint::divmod_assign
                        ((bigint *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      iVar6 = iVar3;
      iVar4 = compare((bigint *)
                      CONCAT44(in_stack_fffffffffffffc8c,
                               CONCAT13(in_stack_fffffffffffffc8b,
                                        CONCAT12(in_stack_fffffffffffffc8a,
                                                 CONCAT11(in_stack_fffffffffffffc89,
                                                          in_stack_fffffffffffffc88)))),
                      in_stack_fffffffffffffc80);
      iVar4 = iVar4 - (uint)bVar2;
      iVar5 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          (bigint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          (bigint *)CONCAT44(uVar9,iVar6));
      bVar1 = 0 < (int)(iVar5 + (uint)bVar2);
      iVar5 = local_c + 1;
      pcVar7[local_c] = (char)iVar3 + '0';
      if ((iVar4 < 0) || (bVar1)) break;
      local_c = iVar5;
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      if (local_2f8 != local_240) {
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      }
    }
    if (iVar4 < 0) {
      local_c = iVar5;
      if ((bVar1) &&
         ((iVar6 = add_compare((bigint *)
                               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                               (bigint *)
                               CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                               (bigint *)CONCAT44(uVar9,iVar6)), 0 < iVar6 ||
          ((iVar6 == 0 && (iVar3 % 2 != 0)))))) {
        pcVar7[local_c + -1] = pcVar7[local_c + -1] + '\x01';
      }
    }
    else {
      pcVar7[local_c] = pcVar7[local_c] + '\x01';
      local_c = iVar5;
    }
    to_unsigned<int>(local_c);
    buffer<char>::try_resize
              ((buffer<char> *)in_stack_fffffffffffffc80,
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    *local_20 = *local_20 - (local_c + -1);
  }
  else {
    *local_20 = *local_20 - (local_c + -1);
    if (local_c == 0) {
      buffer<char>::try_resize
                ((buffer<char> *)in_stack_fffffffffffffc80,
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      iVar6 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          (bigint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          (bigint *)CONCAT44(uVar9,in_stack_fffffffffffffca8));
      cVar8 = '1';
      if (iVar6 < 1) {
        cVar8 = '0';
      }
      pcVar7 = buffer<char>::operator[]<int>(local_18,0);
      *pcVar7 = cVar8;
    }
    else {
      this = local_18;
      to_unsigned<int>(local_c);
      buffer<char>::try_resize(this,CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      for (local_33c = 0; local_33c < local_c + -1; local_33c = local_33c + 1) {
        in_stack_fffffffffffffc7c =
             bigint::divmod_assign
                       ((bigint *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                        (bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
        local_340 = (char)in_stack_fffffffffffffc7c;
        in_stack_fffffffffffffc78 = CONCAT13(local_340 + '0',(int3)in_stack_fffffffffffffc78);
        pcVar7 = buffer<char>::operator[]<int>(local_18,local_33c);
        *pcVar7 = (char)((uint)in_stack_fffffffffffffc78 >> 0x18);
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      }
      iVar6 = bigint::divmod_assign
                        ((bigint *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      iVar3 = add_compare((bigint *)CONCAT44(iVar6,in_stack_fffffffffffffcb8),
                          (bigint *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          (bigint *)CONCAT44(uVar9,in_stack_fffffffffffffca8));
      if ((0 < iVar3) || ((iVar3 == 0 && (iVar6 % 2 != 0)))) {
        if (iVar6 == 9) {
          pcVar7 = buffer<char>::operator[]<int>(local_18,local_c + -1);
          *pcVar7 = ':';
          iVar6 = local_c;
          while( true ) {
            iVar6 = iVar6 + -1;
            bVar2 = false;
            if (0 < iVar6) {
              pcVar7 = buffer<char>::operator[]<int>(local_18,iVar6);
              bVar2 = *pcVar7 == ':';
            }
            if (!bVar2) break;
            pcVar7 = buffer<char>::operator[]<int>(local_18,iVar6);
            *pcVar7 = '0';
            pcVar7 = buffer<char>::operator[]<int>(local_18,iVar6 + -1);
            *pcVar7 = *pcVar7 + '\x01';
          }
          pcVar7 = buffer<char>::operator[]<int>(local_18,0);
          if (*pcVar7 == ':') {
            pcVar7 = buffer<char>::operator[]<int>(local_18,0);
            *pcVar7 = '1';
            *local_20 = *local_20 + 1;
          }
          goto LAB_0014d395;
        }
        iVar6 = iVar6 + 1;
      }
      cVar8 = (char)iVar6 + '0';
      pcVar7 = buffer<char>::operator[]<int>(local_18,local_c + -1);
      *pcVar7 = cVar8;
    }
  }
LAB_0014d395:
  bigint::~bigint((bigint *)0x14d3a2);
  bigint::~bigint((bigint *)0x14d3af);
  bigint::~bigint((bigint *)0x14d3bc);
  bigint::~bigint((bigint *)0x14d3c9);
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}